

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O2

void __thiscall FileTest_CloseError_Test::TestBody(FileTest_CloseError_Test *this)

{
  bool bVar1;
  int __fd;
  char *pcVar2;
  string_view message;
  AssertHelper local_58;
  file f;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  
  open_file();
  close(f.fd_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    message.size_ = 0x11;
    message.data_ = "cannot close file";
    __fd = 9;
    format_system_error_abi_cxx11_(&gtest_expected_message,9,message);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::file::close(&f,__fd);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [96])
               "Expected: f.close() throws an exception of type fmt::system_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
             ,0x10f,pcVar2);
  testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0xffffff;
  local_58.data_._0_4_ = f.fd_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_expected_message,"-1","f.descriptor()",(int *)&gtest_ar,
             (int *)&local_58);
  if ((char)gtest_expected_message._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_expected_message._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_expected_message._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
               ,0x110,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_message._M_string_length);
  fmt::v5::file::~file(&f);
  return;
}

Assistant:

TEST(FileTest, CloseError) {
  file f = open_file();
  FMT_POSIX(close(f.descriptor()));
  EXPECT_SYSTEM_ERROR_NOASSERT(f.close(), EBADF, "cannot close file");
  EXPECT_EQ(-1, f.descriptor());
}